

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::CreateLocalGenerators(cmGlobalGenerator *this)

{
  pointer *pppcVar1;
  pointer ppcVar2;
  iterator __position;
  int iVar3;
  cmLocalGenerator *in_RAX;
  undefined4 extraout_var;
  pointer ppcVar4;
  pointer ppcVar5;
  cmLocalGenerator *local_28;
  
  ppcVar5 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar2 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_28 = in_RAX;
  if (ppcVar5 != ppcVar2) {
    do {
      if (*ppcVar5 != (cmLocalGenerator *)0x0) {
        (*(*ppcVar5)->_vptr_cmLocalGenerator[1])();
      }
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 != ppcVar2);
    ppcVar5 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar5) {
      (this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar5;
    }
  }
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::reserve
            (&this->LocalGenerators,
             (long)(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppcVar4 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar4 !=
      (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar3 = (*this->_vptr_cmGlobalGenerator[2])(this,*ppcVar4);
      local_28 = (cmLocalGenerator *)CONCAT44(extraout_var,iVar3);
      __position._M_current =
           (this->LocalGenerators).
           super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->LocalGenerators).
          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::
        _M_realloc_insert<cmLocalGenerator*>
                  ((vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)
                   &this->LocalGenerators,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        pppcVar1 = &(this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      ppcVar4 = ppcVar4 + 1;
    } while (ppcVar4 !=
             (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateLocalGenerators()
{
  cmDeleteAll(this->LocalGenerators);
  this->LocalGenerators.clear();
  this->LocalGenerators.reserve(this->Makefiles.size());
  for (std::vector<cmMakefile*>::const_iterator it = this->Makefiles.begin();
       it != this->Makefiles.end(); ++it) {
    this->LocalGenerators.push_back(this->CreateLocalGenerator(*it));
  }
}